

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_arshift(lua_State *L)

{
  ulong r_00;
  lua_Integer lVar1;
  lua_Integer i;
  lua_Unsigned r;
  lua_State *L_local;
  
  r_00 = luaL_checkinteger(L,1);
  lVar1 = luaL_checkinteger(L,2);
  if ((lVar1 < 0) || ((r_00 & 0x80000000) == 0)) {
    L_local._4_4_ = b_shift(L,r_00,-lVar1);
  }
  else {
    if (lVar1 < 0x20) {
      i = (r_00 >> ((byte)lVar1 & 0x3f) | 0xffffffffUL >> ((byte)lVar1 & 0x3f) ^ 0xffffffffffffffff)
          & 0xffffffff;
    }
    else {
      i = 0xffffffff;
    }
    lua_pushinteger(L,i);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int b_arshift (lua_State *L) {
  lua_Unsigned r = checkunsigned(L, 1);
  lua_Integer i = luaL_checkinteger(L, 2);
  if (i < 0 || !(r & ((lua_Unsigned)1 << (LUA_NBITS - 1))))
    return b_shift(L, r, -i);
  else {  /* arithmetic shift for 'negative' number */
    if (i >= LUA_NBITS) r = ALLONES;
    else
      r = trim((r >> i) | ~(trim(~(lua_Unsigned)0) >> i));  /* add signal bit */
    pushunsigned(L, r);
    return 1;
  }
}